

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_seeking.c
# Opt level: O3

void shift_cdata(test_state *state,uchar *cbuf_unshifted,int byte_offset,int bit_offset)

{
  byte *pbVar1;
  aec_stream *paVar2;
  uchar *__s;
  byte bVar3;
  ulong uVar4;
  
  paVar2 = state->strm;
  __s = state->cbuf;
  memset(__s,0,state->buf_len);
  if (paVar2->avail_in != 0) {
    pbVar1 = __s + byte_offset;
    bVar3 = *pbVar1;
    uVar4 = 0;
    do {
      pbVar1[uVar4] = cbuf_unshifted[uVar4] >> ((byte)bit_offset & 0x1f) | bVar3;
      bVar3 = cbuf_unshifted[uVar4] << (8 - (byte)bit_offset & 0x1f) | pbVar1[uVar4 + 1];
      pbVar1[uVar4 + 1] = bVar3;
      uVar4 = uVar4 + 1;
    } while (uVar4 < paVar2->avail_in);
  }
  return;
}

Assistant:

void shift_cdata(struct test_state *state, unsigned char *cbuf_unshifted,
                 int byte_offset, int bit_offset)
{
    struct aec_stream *strm = state->strm;
    unsigned char *dst = state->cbuf + byte_offset;

    memset(state->cbuf, 0, state->buf_len);
    for (size_t i = 0; i < strm->avail_in; i++) {
        dst[i] |= cbuf_unshifted[i] >> bit_offset;
        dst[i + 1] |= cbuf_unshifted[i] << (8 - bit_offset);
    }
}